

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Matrix4f.cpp
# Opt level: O0

Matrix2f __thiscall Matrix4f::getSubmatrix2x2(Matrix4f *this,int i0,int j0)

{
  float fVar1;
  float *pfVar2;
  int in_ECX;
  undefined4 in_register_00000034;
  ulong extraout_XMM0_Qa;
  ulong uVar3;
  undefined8 in_XMM1_Qa;
  Matrix2f MVar4;
  undefined4 local_28;
  undefined4 local_24;
  int j;
  int i;
  int j0_local;
  int i0_local;
  Matrix4f *this_local;
  Matrix2f *out;
  
  Matrix2f::Matrix2f((Matrix2f *)this,0.0);
  uVar3 = extraout_XMM0_Qa;
  for (local_24 = 0; local_24 < 2; local_24 = local_24 + 1) {
    for (local_28 = 0; local_28 < 2; local_28 = local_28 + 1) {
      pfVar2 = operator()((Matrix4f *)CONCAT44(in_register_00000034,i0),local_24 + j0,
                          local_28 + in_ECX);
      fVar1 = *pfVar2;
      pfVar2 = Matrix2f::operator()((Matrix2f *)this,local_24,local_28);
      uVar3 = (ulong)(uint)fVar1;
      *pfVar2 = fVar1;
    }
  }
  MVar4.m_elements[2] = (float)(int)in_XMM1_Qa;
  MVar4.m_elements[3] = (float)(int)((ulong)in_XMM1_Qa >> 0x20);
  MVar4.m_elements[0] = (float)(int)uVar3;
  MVar4.m_elements[1] = (float)(int)(uVar3 >> 0x20);
  return (Matrix2f)MVar4.m_elements;
}

Assistant:

Matrix2f Matrix4f::getSubmatrix2x2( int i0, int j0 ) const
{
	Matrix2f out;

	for( int i = 0; i < 2; ++i )
	{
		for( int j = 0; j < 2; ++j )
		{
			out( i, j ) = ( *this )( i + i0, j + j0 );
		}
	}

	return out;
}